

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_binbuf.c
# Opt level: O0

int binbuf_write(_binbuf *x,char *filename,char *dir,int crflag)

{
  int iVar1;
  size_t sVar2;
  int local_1458;
  int local_1454;
  int length;
  int indx;
  _binbuf *z;
  _binbuf *y;
  t_atom *ap;
  char *ep;
  char *bp;
  char fbuf [1000];
  char local_1038 [8];
  char sbuf [4096];
  FILE *f;
  int crflag_local;
  char *dir_local;
  char *filename_local;
  _binbuf *x_local;
  
  sbuf[0xff8] = '\0';
  sbuf[0xff9] = '\0';
  sbuf[0xffa] = '\0';
  sbuf[0xffb] = '\0';
  sbuf[0xffc] = '\0';
  sbuf[0xffd] = '\0';
  sbuf[0xffe] = '\0';
  sbuf[0xfff] = '\0';
  ep = local_1038;
  z = (_binbuf *)0x0;
  if (*dir == '\0') {
    snprintf((char *)&bp,999,"%s",filename);
  }
  else {
    snprintf((char *)&bp,999,"%s/%s",dir,filename);
  }
  fbuf[0x3df] = '\0';
  sVar2 = strlen(filename);
  iVar1 = strcmp(filename + (sVar2 - 4),".pat");
  if (iVar1 != 0) {
    sVar2 = strlen(filename);
    iVar1 = strcmp(filename + (sVar2 - 4),".mxt");
    _length = x;
    if (iVar1 != 0) goto LAB_00199fe2;
  }
  _length = binbuf_convert(x,0);
  z = _length;
LAB_00199fe2:
  sbuf._4088_8_ = sys_fopen((char *)&bp,"w");
  if ((FILE *)sbuf._4088_8_ != (FILE *)0x0) {
    y = (_binbuf *)_length->b_vec;
    local_1454 = _length->b_n;
    while (local_1454 != 0) {
      if ((y->b_n == 2) || (y->b_n == 9)) {
        sVar2 = strlen(*(char **)y->b_vec);
        local_1458 = (int)sVar2 + 0x50;
      }
      else {
        local_1458 = 0x28;
      }
      if ((long)(sbuf + 0xff8) - (long)ep < (long)local_1458) {
        sVar2 = fwrite(local_1038,(long)ep - (long)local_1038,1,(FILE *)sbuf._4088_8_);
        if (sVar2 == 0) goto LAB_0019a24d;
        ep = local_1038;
      }
      if ((((y->b_n == 4) || (y->b_n == 5)) && (local_1038 < ep)) && (ep[-1] == ' ')) {
        ep = ep + -1;
      }
      if ((crflag == 0) || (y->b_n != 4)) {
        atom_string((t_atom *)y,ep,((int)(sbuf + 0xff8) - (int)ep) - 2);
        sVar2 = strlen(ep);
        ep = ep + (int)sVar2;
      }
      if (y->b_n == 4) {
        *ep = '\n';
      }
      else {
        *ep = ' ';
      }
      ep = ep + 1;
      y = y + 1;
      local_1454 = local_1454 + -1;
    }
    sVar2 = fwrite(local_1038,(long)ep - (long)local_1038,1,(FILE *)sbuf._4088_8_);
    if ((sVar2 != 0) && (iVar1 = fflush((FILE *)sbuf._4088_8_), iVar1 == 0)) {
      if (z != (_binbuf *)0x0) {
        binbuf_free(z);
      }
      fclose((FILE *)sbuf._4088_8_);
      return 0;
    }
  }
LAB_0019a24d:
  if (z != (_binbuf *)0x0) {
    binbuf_free(z);
  }
  if (sbuf._4088_8_ != 0) {
    fclose((FILE *)sbuf._4088_8_);
  }
  return 1;
}

Assistant:

int binbuf_write(const t_binbuf *x, const char *filename, const char *dir, int crflag)
{
    FILE *f = 0;
    char sbuf[WBUFSIZE], fbuf[MAXPDSTRING], *bp = sbuf, *ep = sbuf + WBUFSIZE;
    t_atom *ap;
    t_binbuf *y = 0;
    const t_binbuf *z = x;
    int indx;

    if (*dir)
        snprintf(fbuf, MAXPDSTRING-1, "%s/%s", dir, filename);
    else
        snprintf(fbuf, MAXPDSTRING-1, "%s", filename);
    fbuf[MAXPDSTRING-1] = 0;

    if (!strcmp(filename + strlen(filename) - 4, ".pat") ||
        !strcmp(filename + strlen(filename) - 4, ".mxt"))
    {
        y = binbuf_convert(x, 0);
        z = y;
    }

    if (!(f = sys_fopen(fbuf, "w")))
        goto fail;
    for (ap = z->b_vec, indx = z->b_n; indx--; ap++)
    {
        int length;
            /* estimate how many characters will be needed.  Printing out
            symbols may need extra characters for inserting backslashes. */
        if (ap->a_type == A_SYMBOL || ap->a_type == A_DOLLSYM)
            length = 80 + (int)strlen(ap->a_w.w_symbol->s_name);
        else length = 40;
        if (ep - bp < length)
        {
            if (fwrite(sbuf, bp-sbuf, 1, f) < 1)
                goto fail;
            bp = sbuf;
        }
        if ((ap->a_type == A_SEMI || ap->a_type == A_COMMA) &&
            bp > sbuf && bp[-1] == ' ') bp--;
        if (!crflag || ap->a_type != A_SEMI)
        {
            atom_string(ap, bp, (unsigned int)((ep-bp)-2));
            length = (int)strlen(bp);
            bp += length;
        }
        if (ap->a_type == A_SEMI)
        {
            *bp++ = '\n';
        }
        else
        {
            *bp++ = ' ';
        }
    }
    if (fwrite(sbuf, bp-sbuf, 1, f) < 1)
        goto fail;

    if (fflush(f) != 0)
        goto fail;

    if (y)
        binbuf_free(y);
    fclose(f);
    return (0);
fail:
    if (y)
        binbuf_free(y);
    if (f)
        fclose(f);
    return (1);
}